

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

int __thiscall crnlib::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_short> *this_00;
  vector<unsigned_char> *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  uint min_new_capacity;
  color_quad_u8 cVar4;
  unsigned_short *puVar5;
  color_quad_u8 *pcVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  ulong uVar10;
  undefined1 auVar11 [13];
  uint i_1;
  uint uVar12;
  uint *puVar13;
  uint *puVar14;
  results *in_RDX;
  ulong uVar15;
  uint i;
  long lVar16;
  float fVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar22;
  undefined1 auVar21 [16];
  vec3F avg_color;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  min_new_capacity = *(uint *)(ctx + 8);
  uVar12 = (this->m_selectors).m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if ((this->m_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_selectors,min_new_capacity,
                   uVar12 + 1 == min_new_capacity,1,(object_mover)0x0,false);
        uVar12 = (this->m_selectors).m_size;
      }
      memset((this->m_selectors).m_p + uVar12,0,(ulong)(min_new_capacity - uVar12));
    }
    (this->m_selectors).m_size = min_new_capacity;
  }
  uVar12 = (this->m_best_selectors).m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if ((this->m_best_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_best_selectors,min_new_capacity,
                   uVar12 + 1 == min_new_capacity,1,(object_mover)0x0,false);
        uVar12 = (this->m_best_selectors).m_size;
      }
      memset((this->m_best_selectors).m_p + uVar12,0,(ulong)(min_new_capacity - uVar12));
    }
    (this->m_best_selectors).m_size = min_new_capacity;
  }
  uVar12 = (this->m_temp_selectors).m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if ((this->m_temp_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_temp_selectors,min_new_capacity,
                   uVar12 + 1 == min_new_capacity,1,(object_mover)0x0,false);
        uVar12 = (this->m_temp_selectors).m_size;
      }
      memset((this->m_temp_selectors).m_p + uVar12,0,(ulong)(min_new_capacity - uVar12));
    }
    (this->m_temp_selectors).m_size = min_new_capacity;
  }
  pvVar1 = &(this->m_trial_solution).m_selectors;
  uVar12 = (this->m_trial_solution).m_selectors.m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if ((this->m_trial_solution).m_selectors.m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar1,min_new_capacity,uVar12 + 1 == min_new_capacity,1,
                   (object_mover)0x0,false);
        uVar12 = (this->m_trial_solution).m_selectors.m_size;
      }
      memset(pvVar1->m_p + uVar12,0,(ulong)(min_new_capacity - uVar12));
    }
    (this->m_trial_solution).m_selectors.m_size = min_new_capacity;
  }
  pvVar1 = &(this->m_best_solution).m_selectors;
  uVar12 = (this->m_best_solution).m_selectors.m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if ((this->m_best_solution).m_selectors.m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar1,min_new_capacity,uVar12 + 1 == min_new_capacity,1,
                   (object_mover)0x0,false);
        uVar12 = (this->m_best_solution).m_selectors.m_size;
      }
      memset(pvVar1->m_p + uVar12,0,(ulong)(min_new_capacity - uVar12));
    }
    (this->m_best_solution).m_selectors.m_size = min_new_capacity;
  }
  this->m_limit = (this->m_pParams->m_use_color4 ^ 1) << 4 | 0xf;
  local_38 = 0.0;
  local_40 = 0;
  this_00 = &this->m_luma;
  uVar12 = (this->m_luma).m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if ((this->m_luma).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,min_new_capacity,uVar12 + 1 == min_new_capacity,2,
                   (object_mover)0x0,false);
        uVar12 = (this->m_luma).m_size;
      }
      memset(this_00->m_p + uVar12,0,(ulong)(min_new_capacity - uVar12) * 2);
    }
    (this->m_luma).m_size = min_new_capacity;
  }
  uVar12 = this->m_sorted_luma[0].m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if (this->m_sorted_luma[0].m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this->m_sorted_luma,min_new_capacity,
                   uVar12 + 1 == min_new_capacity,4,(object_mover)0x0,false);
        uVar12 = this->m_sorted_luma[0].m_size;
      }
      memset(this->m_sorted_luma[0].m_p + uVar12,0,(ulong)(min_new_capacity - uVar12) << 2);
    }
    this->m_sorted_luma[0].m_size = min_new_capacity;
  }
  uVar12 = this->m_sorted_luma[1].m_size;
  if (uVar12 != min_new_capacity) {
    if (uVar12 <= min_new_capacity) {
      if (this->m_sorted_luma[1].m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)(this->m_sorted_luma + 1),min_new_capacity,
                   uVar12 + 1 == min_new_capacity,4,(object_mover)0x0,false);
        uVar12 = this->m_sorted_luma[1].m_size;
      }
      memset((void *)((ulong)uVar12 * 4 + (long)((elemental_vector *)(this->m_sorted_luma + 1))->m_p
                     ),0,(ulong)(min_new_capacity - uVar12) << 2);
    }
    this->m_sorted_luma[1].m_size = min_new_capacity;
  }
  if (min_new_capacity != 0) {
    puVar5 = (this->m_luma).m_p;
    pcVar6 = this->m_pParams->m_pSrc_pixels;
    puVar14 = this->m_sorted_luma[0].m_p;
    uVar15 = 0;
    do {
      bVar3 = pcVar6[uVar15].field_0.field_0.b;
      cVar4.field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           pcVar6[uVar15].field_0.m_u32;
      uVar10 = (ulong)cVar4.field_0._0_2_ & 0xffffffffffff00ff;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar10;
      auVar7[0xc] = cVar4.field_0._3_1_;
      auVar8[8] = cVar4.field_0._2_1_;
      auVar8._0_8_ = uVar10;
      auVar8[9] = 0;
      auVar8._10_3_ = auVar7._10_3_;
      auVar11._5_8_ = 0;
      auVar11._0_5_ = auVar8._8_5_;
      auVar9[4] = cVar4.field_0._1_1_;
      auVar9._0_4_ = (int)uVar10;
      auVar9[5] = 0;
      auVar9._6_7_ = SUB137(auVar11 << 0x40,6);
      local_30 = CONCAT44((float)auVar9._4_4_,(float)(int)uVar10);
      local_28 = (float)bVar3;
      lVar16 = 0;
      do {
        *(float *)((long)&local_40 + lVar16 * 4) =
             *(float *)((long)&local_30 + lVar16 * 4) + *(float *)((long)&local_40 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      puVar5[uVar15] = (cVar4.field_0._0_2_ & 0xff) + (ushort)bVar3 + (cVar4.field_0._1_2_ & 0xff);
      puVar14[uVar15] = (uint)uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar15 != min_new_capacity);
  }
  lVar16 = 0;
  do {
    *(float *)((long)&local_40 + lVar16 * 4) =
         *(float *)((long)&local_40 + lVar16 * 4) / (float)min_new_capacity;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  *(undefined8 *)(this->m_avg_color).m_s = local_40;
  (this->m_avg_color).m_s[2] = local_38;
  uVar12 = this->m_limit;
  fVar17 = (float)(int)uVar12;
  uVar2 = *(undefined8 *)(this->m_avg_color).m_s;
  auVar21._0_4_ = fVar17 * (float)uVar2;
  auVar21._4_4_ = fVar17 * (float)((ulong)uVar2 >> 0x20);
  auVar21._8_4_ = fVar17 * 0.0;
  auVar21._12_4_ = fVar17 * 0.0;
  auVar21 = divps(auVar21,_DAT_001b0400);
  fVar20 = auVar21._0_4_ + 0.5;
  fVar22 = auVar21._4_4_ + 0.5;
  uVar18 = (uint)fVar20;
  uVar19 = (uint)fVar22;
  uVar18 = (int)(fVar20 - 2.1474836e+09) & (int)uVar18 >> 0x1f | uVar18;
  uVar19 = (int)(fVar22 - 2.1474836e+09) & (int)uVar19 >> 0x1f | uVar19;
  this->m_br = ~-(uint)((int)uVar18 < 0) &
               (~-(uint)((int)uVar18 < (int)uVar12) & uVar12 |
               uVar18 & -(uint)((int)uVar18 < (int)uVar12));
  this->m_bg = ~-(uint)((int)uVar19 < 0) &
               (~-(uint)((int)uVar19 < (int)uVar12) & uVar12 |
               uVar19 & -(uint)((int)uVar19 < (int)uVar12));
  uVar18 = (uint)(long)((fVar17 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if ((int)uVar18 < (int)uVar12) {
    uVar12 = uVar18;
  }
  uVar19 = 0;
  if (-1 < (int)uVar18) {
    uVar19 = uVar12;
  }
  this->m_bb = uVar19;
  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality < cCRNETCQualitySlow) {
    puVar13 = indirect_radix_sort<unsigned_int,unsigned_short>
                        (min_new_capacity,this->m_sorted_luma[0].m_p,this->m_sorted_luma[1].m_p,
                         (this->m_luma).m_p,0,2,false);
    this->m_pSorted_luma_indices = puVar13;
    puVar14 = this->m_sorted_luma[0].m_p;
    this->m_pSorted_luma = puVar14;
    if (puVar13 == puVar14) {
      puVar14 = this->m_sorted_luma[1].m_p;
      this->m_pSorted_luma = puVar14;
    }
    if (min_new_capacity != 0) {
      puVar5 = this_00->m_p;
      uVar15 = 0;
      do {
        puVar14[uVar15] = (uint)puVar5[puVar13[uVar15]];
        uVar15 = uVar15 + 1;
      } while (min_new_capacity != uVar15);
    }
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& params, results& result)
    {
        m_pParams = &params;
        m_pResult = &result;

        const uint n = m_pParams->m_num_src_pixels;

        m_selectors.resize(n);
        m_best_selectors.resize(n);
        m_temp_selectors.resize(n);
        m_trial_solution.m_selectors.resize(n);
        m_best_solution.m_selectors.resize(n);

        m_limit = m_pParams->m_use_color4 ? 15 : 31;

        vec3F avg_color(0.0f);

        m_luma.resize(n);
        m_sorted_luma[0].resize(n);
        m_sorted_luma[1].resize(n);

        for (uint i = 0; i < n; i++)
        {
            const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
            const vec3F fc(c.r, c.g, c.b);

            avg_color += fc;

            m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
            m_sorted_luma[0][i] = i;
        }
        avg_color /= static_cast<float>(n);
        m_avg_color = avg_color;

        m_br = math::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
        m_bg = math::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
        m_bb = math::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

        if (m_pParams->m_quality <= cCRNETCQualityMedium)
        {
            m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0].get_ptr(), m_sorted_luma[1].get_ptr(), m_luma.get_ptr(), 0, sizeof(m_luma[0]), false);
            m_pSorted_luma = m_sorted_luma[0].get_ptr();
            if (m_pSorted_luma_indices == m_sorted_luma[0].get_ptr())
            {
                m_pSorted_luma = m_sorted_luma[1].get_ptr();
            }

            for (uint i = 0; i < n; i++)
            {
                m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
            }
        }

        m_best_solution.m_coords.clear();
        m_best_solution.m_valid = false;
        m_best_solution.m_error = cUINT64_MAX;
    }